

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O3

void StateGetHandCard(pyhanabi_state_t *state,int pid,int index,pyhanabi_card_t *card)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  if (state == (pyhanabi_state_t *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x18e,"void StateGetHandCard(pyhanabi_state_t *, int, int, pyhanabi_card_t *)");
  }
  pvVar1 = state->state;
  if (pvVar1 == (void *)0x0) {
    __assert_fail("state->state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,399,"void StateGetHandCard(pyhanabi_state_t *, int, int, pyhanabi_card_t *)");
  }
  if (card == (pyhanabi_card_t *)0x0) {
    __assert_fail("card != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,400,"void StateGetHandCard(pyhanabi_state_t *, int, int, pyhanabi_card_t *)");
  }
  uVar5 = (ulong)pid;
  lVar2 = *(long *)((long)pvVar1 + 0x40);
  uVar4 = (*(long *)((long)pvVar1 + 0x48) - lVar2 >> 4) * -0x5555555555555555;
  if (uVar5 <= uVar4 && uVar4 - uVar5 != 0) {
    lVar6 = uVar5 * 0x30;
    uVar5 = (ulong)index;
    lVar3 = *(long *)(lVar2 + lVar6);
    uVar4 = *(long *)(lVar2 + 8 + lVar6) - lVar3 >> 3;
    if (uVar5 < uVar4) {
      *card = *(pyhanabi_card_t *)(lVar3 + uVar5 * 8);
      return;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5,uVar4
            );
}

Assistant:

void StateGetHandCard(pyhanabi_state_t* state, int pid, int index,
                      pyhanabi_card_t* card) {
  REQUIRE(state != nullptr);
  REQUIRE(state->state != nullptr);
  REQUIRE(card != nullptr);
  hanabi_learning_env::HanabiCard hanabi_card =
      reinterpret_cast<hanabi_learning_env::HanabiState*>(state->state)
          ->Hands()
          .at(pid)
          .Cards()
          .at(index);
  card->color = hanabi_card.Color();
  card->rank = hanabi_card.Rank();
}